

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O1

QAction * __thiscall QtMWidgets::ToolBar::actionAt(ToolBar *this,QPoint *p)

{
  ToolBarLayout *pTVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long *plVar5;
  long lVar6;
  
  uVar4 = QWidget::childAt((QPoint *)this);
  pTVar1 = ((this->d).d)->layout;
  iVar2 = (**(code **)(*(long *)pTVar1 + 0xb8))(pTVar1,uVar4);
  if ((1 < iVar2 + 1U) &&
     (iVar3 = (**(code **)(*(long *)((this->d).d)->layout + 200))(), iVar2 != iVar3 + 1)) {
    pTVar1 = ((this->d).d)->layout;
    plVar5 = (long *)(**(code **)(*(long *)pTVar1 + 0xa8))(pTVar1,iVar2);
    if (plVar5 == (long *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar6 = (**(code **)(*plVar5 + 0x68))(plVar5);
    }
    if (lVar6 != 0) {
      return *(QAction **)(*(long *)(lVar6 + 0x28) + 8);
    }
  }
  return (QAction *)0x0;
}

Assistant:

QAction *
ToolBar::actionAt( const QPoint & p ) const
{
	QWidget * widget = childAt( p );

	int index = d->layout->indexOf( widget );

	if( index == -1 || index == 0 || index == d->layout->count() + 1 )
		return 0;

	QLayoutItem * item = d->layout->itemAt( index );

	ToolButton * b = 0;

	if( item )
		b = static_cast< ToolButton* > ( item->widget() );

	if( b )
		return b->action();
	else
		return 0;
}